

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_udp.c
# Opt level: O3

void nni_plat_udp_close(nni_plat_udp *udp)

{
  nni_mtx *mtx;
  
  nni_posix_pfd_stop(&udp->udp_pfd);
  mtx = &udp->udp_mtx;
  nni_mtx_lock(mtx);
  nni_posix_udp_doerror(udp,7);
  nni_mtx_unlock(mtx);
  nni_posix_pfd_stop(&udp->udp_pfd);
  nni_posix_pfd_fini(&udp->udp_pfd);
  close(udp->udp_fd);
  nni_mtx_fini(mtx);
  nni_free(udp,0x98);
  return;
}

Assistant:

void
nni_plat_udp_close(nni_plat_udp *udp)
{
	nni_posix_pfd_stop(&udp->udp_pfd);

	nni_mtx_lock(&udp->udp_mtx);
	nni_posix_udp_doclose(udp);
	nni_mtx_unlock(&udp->udp_mtx);

	nni_posix_pfd_stop(&udp->udp_pfd);
	nni_posix_pfd_fini(&udp->udp_pfd);
	(void) close(udp->udp_fd);
	nni_mtx_fini(&udp->udp_mtx);
	NNI_FREE_STRUCT(udp);
}